

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void bfgs_iter_middle<sparse_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  double dVar7;
  float fVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  int iVar13;
  _Hash_node_base *p_Var14;
  _Hash_node_base *p_Var15;
  anon_union_4_2_947300a4 x;
  float fVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  if (b->m == 0) {
    p_Var15 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var15 == (_Hash_node_base *)0x0) {
      fVar16 = NAN;
    }
    else {
      fVar16 = 0.0;
      fVar8 = 0.0;
      p_Var14 = p_Var15;
      do {
        p_Var1 = p_Var14 + 1;
        p_Var2 = p_Var14 + 2;
        p_Var14 = p_Var14->_M_nxt;
        fVar3 = *(float *)((long)&p_Var2->_M_nxt->_M_nxt + 4);
        fVar4 = mem[(long)(*origin % b->mem_stride) +
                    ((ulong)p_Var1->_M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                    (long)b->mem_stride];
        fVar5 = *(float *)((long)&p_Var2->_M_nxt[1]._M_nxt + 4);
        fVar16 = fVar16 + (fVar3 - fVar4) * fVar5 * fVar3;
        fVar8 = fVar8 + fVar4 * fVar5 * fVar4;
      } while (p_Var14 != (_Hash_node_base *)0x0);
      fVar16 = fVar16 / fVar8;
    }
    if ((fVar16 < 0.0) || ((~(uint)fVar16 & 0x7fc00000) == 0)) {
      fVar16 = 0.0;
    }
    for (; p_Var15 != (_Hash_node_base *)0x0; p_Var15 = p_Var15->_M_nxt) {
      mem[((ulong)p_Var15[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride
          + (long)(*origin % b->mem_stride)] = *(float *)((long)&(p_Var15[2]._M_nxt)->_M_nxt + 4);
      *(float *)&p_Var15[2]._M_nxt[1]._M_nxt = *(float *)&p_Var15[2]._M_nxt[1]._M_nxt * fVar16;
      p_Var14 = p_Var15[2]._M_nxt;
      *(float *)&p_Var14[1]._M_nxt =
           *(float *)&p_Var14[1]._M_nxt -
           *(float *)((long)&p_Var14[1]._M_nxt + 4) * *(float *)((long)&p_Var14->_M_nxt + 4);
      *(undefined4 *)((long)&(p_Var15[2]._M_nxt)->_M_nxt + 4) = 0;
    }
    if (all->quiet == false) {
      bfgs_iter_middle<sparse_parameters>();
    }
  }
  else {
    if (all->quiet == false) {
      bfgs_iter_middle<sparse_parameters>();
    }
    dVar17 = 0.0;
    dVar18 = 0.0;
    dVar7 = 0.0;
    for (p_Var15 = (weights->_map)._M_h._M_before_begin._M_nxt; p_Var15 != (_Hash_node_base *)0x0;
        p_Var15 = p_Var15->_M_nxt) {
      lVar10 = ((ulong)p_Var15[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
               (long)b->mem_stride;
      lVar11 = (long)(*origin % b->mem_stride);
      mem[lVar10 + lVar11] =
           *(float *)((long)&(p_Var15[2]._M_nxt)->_M_nxt + 4) - mem[lVar10 + lVar11];
      lVar11 = (long)((*origin + 1) % b->mem_stride);
      mem[lVar10 + lVar11] = *(float *)&(p_Var15[2]._M_nxt)->_M_nxt - mem[lVar10 + lVar11];
      *(undefined4 *)&p_Var15[2]._M_nxt[1]._M_nxt =
           *(undefined4 *)((long)&(p_Var15[2]._M_nxt)->_M_nxt + 4);
      dVar19 = (double)mem[lVar10 + *origin % b->mem_stride];
      dVar7 = dVar7 + dVar19 * (double)mem[lVar10 + (*origin + 1) % b->mem_stride];
      dVar17 = dVar17 + (double)mem[lVar10 + (*origin + 1) % b->mem_stride] *
                        (double)*(float *)((long)&(p_Var15[2]._M_nxt)->_M_nxt + 4);
      dVar18 = dVar18 + dVar19 * dVar19 * (double)*(float *)((long)&p_Var15[2]._M_nxt[1]._M_nxt + 4)
      ;
    }
    if ((dVar7 <= 0.0) || (dVar18 <= 0.0)) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = &PTR__exception_002d8f28;
      __cxa_throw(puVar12,&curv_exception::typeinfo,std::exception::~exception);
    }
    *rho = 1.0 / dVar7;
    iVar9 = *lastj;
    if (0 < iVar9) {
      lVar10 = 0;
      do {
        alpha[lVar10] = dVar17 * rho[lVar10];
        p_Var15 = (weights->_map)._M_h._M_before_begin._M_nxt;
        if (p_Var15 == (_Hash_node_base *)0x0) {
          dVar17 = 0.0;
        }
        else {
          dVar17 = 0.0;
          do {
            lVar11 = ((ulong)p_Var15[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                     (long)b->mem_stride;
            *(float *)&p_Var15[2]._M_nxt[1]._M_nxt =
                 *(float *)&p_Var15[2]._M_nxt[1]._M_nxt -
                 (float)alpha[lVar10] * mem[lVar11 + (*origin + (int)lVar10 * 2) % b->mem_stride];
            p_Var14 = p_Var15 + 2;
            p_Var15 = p_Var15->_M_nxt;
            dVar17 = dVar17 + (double)*(float *)&p_Var14->_M_nxt[1]._M_nxt *
                              (double)mem[lVar11 + (*origin + (int)lVar10 * 2 + 3) % b->mem_stride];
          } while (p_Var15 != (_Hash_node_base *)0x0);
        }
        lVar10 = lVar10 + 1;
        iVar9 = *lastj;
      } while (lVar10 < iVar9);
    }
    alpha[iVar9] = dVar17 * rho[iVar9];
    p_Var15 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var15 == (_Hash_node_base *)0x0) {
      dVar17 = 0.0;
    }
    else {
      dVar17 = 0.0;
      do {
        lVar10 = ((ulong)p_Var15[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                 (long)b->mem_stride;
        *(float *)&p_Var15[2]._M_nxt[1]._M_nxt =
             *(float *)&p_Var15[2]._M_nxt[1]._M_nxt -
             (float)alpha[*lastj] * mem[lVar10 + (*lastj * 2 + *origin) % b->mem_stride];
        p_Var14 = p_Var15[2]._M_nxt;
        *(float *)&p_Var14[1]._M_nxt =
             *(float *)((long)&p_Var14[1]._M_nxt + 4) * (float)(dVar7 / dVar18) *
             *(float *)&p_Var14[1]._M_nxt;
        p_Var14 = p_Var15 + 2;
        p_Var15 = p_Var15->_M_nxt;
        dVar17 = dVar17 + (double)*(float *)&p_Var14->_M_nxt[1]._M_nxt *
                          (double)mem[lVar10 + (*lastj * 2 + *origin) % b->mem_stride];
      } while (p_Var15 != (_Hash_node_base *)0x0);
    }
    lVar10 = (long)*lastj;
    if (0 < (long)*lastj) {
      do {
        p_Var15 = (weights->_map)._M_h._M_before_begin._M_nxt;
        if (p_Var15 == (_Hash_node_base *)0x0) {
          dVar17 = 0.0;
        }
        else {
          dVar18 = dVar17 * rho[lVar10];
          dVar7 = alpha[lVar10];
          dVar17 = 0.0;
          do {
            lVar11 = ((ulong)p_Var15[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                     (long)b->mem_stride;
            *(float *)&p_Var15[2]._M_nxt[1]._M_nxt =
                 mem[lVar11 + (*origin + (int)lVar10 * 2 + 1) % b->mem_stride] *
                 (float)(dVar7 - dVar18) + *(float *)&p_Var15[2]._M_nxt[1]._M_nxt;
            p_Var14 = p_Var15 + 2;
            p_Var15 = p_Var15->_M_nxt;
            dVar17 = dVar17 + (double)*(float *)&p_Var14->_M_nxt[1]._M_nxt *
                              (double)mem[lVar11 + (*origin + (int)lVar10 * 2 + -2) % b->mem_stride]
            ;
          } while (p_Var15 != (_Hash_node_base *)0x0);
        }
        bVar6 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar6);
    }
    p_Var15 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var15 != (_Hash_node_base *)0x0) {
      dVar7 = *alpha;
      dVar18 = *rho;
      do {
        *(float *)&p_Var15[2]._M_nxt[1]._M_nxt =
             mem[((ulong)p_Var15[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                 (long)b->mem_stride + (long)((*origin + 1) % b->mem_stride)] *
             -(float)(dVar7 - dVar17 * dVar18) - *(float *)&p_Var15[2]._M_nxt[1]._M_nxt;
        p_Var15 = p_Var15->_M_nxt;
      } while (p_Var15 != (_Hash_node_base *)0x0);
    }
    iVar13 = b->m + -1;
    iVar9 = *lastj + 1;
    if (iVar13 <= *lastj) {
      iVar9 = iVar13;
    }
    *lastj = iVar9;
    *origin = (*origin + b->mem_stride + -2) % b->mem_stride;
    for (p_Var15 = (weights->_map)._M_h._M_before_begin._M_nxt; p_Var15 != (_Hash_node_base *)0x0;
        p_Var15 = p_Var15->_M_nxt) {
      lVar10 = ((ulong)p_Var15[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
               (long)b->mem_stride;
      mem[lVar10 + *origin % b->mem_stride] = *(float *)((long)&(p_Var15[2]._M_nxt)->_M_nxt + 4);
      mem[lVar10 + (*origin + 1) % b->mem_stride] = *(float *)&(p_Var15[2]._M_nxt)->_M_nxt;
      *(undefined4 *)((long)&(p_Var15[2]._M_nxt)->_M_nxt + 4) = 0;
    }
    if (0 < (long)*lastj) {
      lVar10 = (long)*lastj + 1;
      do {
        rho[lVar10 + -1] = rho[lVar10 + -2];
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
    }
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}